

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O0

MapInfo * __thiscall
HawkTracer::client::TracepointMap::get_label_info
          (MapInfo *__return_storage_ptr__,TracepointMap *this,uint64_t label)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *this_00;
  ostream *poVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
  local_28;
  iterator it;
  uint64_t label_local;
  TracepointMap *this_local;
  MapInfo *info;
  
  it.
  super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
               )label;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_HawkTracer::client::TracepointMap::MapInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>_>
       ::find(&this->_input_map,(key_type *)&it);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_HawkTracer::client::TracepointMap::MapInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>_>
       ::end(&this->_input_map);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false,_false>
                           *)&local_28);
    MapInfo::MapInfo(__return_storage_ptr__,&ppVar2->second);
  }
  else {
    std::__cxx11::to_string
              ((__cxx11 *)__return_storage_ptr__,
               (unsigned_long)
               it.
               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
               ._M_cur);
    category_to_string_abi_cxx11_((TracepointMap *)&__return_storage_ptr__->category,Unknown);
    this_00 = std::
              unordered_map<unsigned_long,_HawkTracer::client::TracepointMap::MapInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>_>
              ::operator[](&this->_input_map,(key_type *)&it);
    MapInfo::operator=(this_00,__return_storage_ptr__);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot find mapping for label ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(ulong)it.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                                      ._M_cur);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

TracepointMap::MapInfo TracepointMap::get_label_info(uint64_t label)
{
    auto it = _input_map.find(label);

    if (it != _input_map.end())
    {
        return it->second;
    }

    MapInfo info = { std::to_string(label), category_to_string(Unknown) };
    _input_map[label] = info;

    std::cerr << "Cannot find mapping for label " << label << std::endl;
    return info;
}